

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::CallForHelp::CallForHelp(CallForHelp *this,string *msg,ExitCodes exit_code)

{
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"CallForHelp",&local_69);
  ::std::__cxx11::string::string(&local_68,msg);
  Success::Success(&this->super_Success,&local_48,&local_68,exit_code);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)&(this->super_Success).super_ParseError.super_Error = &PTR__Error_00443bb8;
  return;
}

Assistant:

CallForHelp() : CallForHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}